

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O2

void __thiscall
FDDSTexture::DecompressDXT3(FDDSTexture *this,FWadLump *lump,bool premultiplied,BYTE *tcbuf)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  PalEntry PVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  byte bVar9;
  uint uVar10;
  void *pvVar11;
  BYTE BVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  void *pvVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  PalEntry color [4];
  undefined4 local_50;
  BYTE palcol [4];
  
  uVar15 = (ulong)((uint)(this->super_FTexture).Width * 4 + 0xc & 0xfffffff0);
  pvVar11 = operator_new__(uVar15);
  for (uVar20 = 0; uVar20 < (this->super_FTexture).Height; uVar20 = uVar20 + 4) {
    (*(lump->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])(lump,pvVar11,uVar15);
    pvVar18 = pvVar11;
    for (uVar17 = 0; uVar17 < (this->super_FTexture).Width; uVar17 = uVar17 + 4) {
      local_50 = *(undefined4 *)((long)pvVar18 + 8);
      for (uVar10 = 1; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
        uVar13 = (ulong)uVar10;
        uVar3 = *(ushort *)(palcol + uVar13 * 2 + -4);
        bVar2 = (byte)(uVar3 >> 8);
        color[uVar13].field_0.field_0.r = (bVar2 >> 5) + (bVar2 & 0xf8);
        color[uVar13].field_0.field_0.g = bVar2 >> 1 & 3 | (byte)(uVar3 >> 3) & 0xfc;
        color[uVar13].field_0.field_0.b = ((byte)(uVar3 >> 2) & 7) + (char)uVar3 * '\b';
      }
      color[2].field_0.field_0.r =
           (BYTE)(((uint)(byte)color[1].field_0._2_1_ + (uint)(byte)color[0].field_0._2_1_ * 2 + 1)
                 / 3);
      color[2].field_0.field_0.g =
           (BYTE)(((byte)color[1].field_0._1_1_ + 1 + (uint)(byte)color[0].field_0._1_1_ * 2) / 3);
      color[2].field_0.field_0.b =
           (BYTE)(((uint)(byte)color[1].field_0._0_1_ + (uint)(byte)color[0].field_0._0_1_ * 2 + 1)
                 / 3);
      color[3].field_0.field_0.r =
           (BYTE)(((uint)(byte)color[0].field_0._2_1_ + (uint)(byte)color[1].field_0._2_1_ * 2 + 1)
                 / 3);
      color[3].field_0.field_0.g =
           (BYTE)(((uint)(byte)color[0].field_0._1_1_ + (uint)(byte)color[1].field_0._1_1_ * 2 + 1)
                 / 3);
      color[3].field_0.field_0.b =
           (BYTE)(((byte)color[0].field_0._0_1_ + 1 + (uint)(byte)color[1].field_0._0_1_ * 2) / 3);
      if (tcbuf == (BYTE *)0x0) {
        for (uVar10 = 3; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
          palcol[uVar10] =
               RGB32k.All
               [(ulong)(color[uVar10].field_0.field_0.b >> 3) +
                (ulong)(color[uVar10].field_0.field_0.g & 0xfffffff8) * 4 +
                (ulong)((color[uVar10].field_0.field_0.r & 0xf8) << 7)];
        }
      }
      uVar13 = uVar20 & 0xffffffff;
      for (uVar16 = 0; (uVar16 != 4 && ((uVar16 | uVar20) < (ulong)(this->super_FTexture).Height));
          uVar16 = uVar16 + 1) {
        bVar2 = *(byte *)((long)pvVar18 + uVar16 + 0xc);
        uVar3 = *(ushort *)((long)pvVar18 + uVar16 * 2);
        bVar9 = 0;
        iVar14 = 0;
        for (uVar10 = uVar17;
            (iVar14 != 0x10 && (uVar19 = (uint)(this->super_FTexture).Width, uVar10 < uVar19));
            uVar10 = uVar10 + 1) {
          if (tcbuf == (BYTE *)0x0) {
            if ((uVar3 >> ((byte)iVar14 & 0x1f) & 8) == 0) {
              puVar1 = &(this->super_FTexture).field_0x31;
              *puVar1 = *puVar1 | 8;
              BVar12 = '\0';
            }
            else {
              BVar12 = palcol[bVar2 >> (bVar9 & 0x1f) & 3];
            }
            this->Pixels[(ulong)uVar10 * (ulong)(this->super_FTexture).Height + (uVar16 | uVar20)] =
                 BVar12;
          }
          else {
            PVar4.field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)
                 *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                  &color[bVar2 >> (bVar9 & 0x1f) & 3].field_0.field_0;
            auVar21 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)PVar4
                                                  .field_0._3_1_ << 0x30) >> 0x28),
                                                  CONCAT14(PVar4.field_0._2_1_,PVar4.field_0)) >>
                                                  0x20),PVar4.field_0) >> 0x18),PVar4.field_0._1_1_)
                                       ,(ushort)PVar4.field_0._0_1_) & 0xffffff00ffffff);
            auVar21 = pshuflw(auVar21,auVar21,0xc6);
            sVar5 = auVar21._0_2_;
            sVar6 = auVar21._2_2_;
            sVar7 = auVar21._4_2_;
            sVar8 = auVar21._6_2_;
            *(uint *)(tcbuf + (int)((uVar19 * (int)uVar13 + uVar10) * 4)) =
                 CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar21[6] - (0xff < sVar8),
                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar21[4] - (0xff < sVar7),
                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar21[2] -
                                            (0xff < sVar6),
                                            (0 < sVar5) * (sVar5 < 0x100) * auVar21[0] -
                                            (0xff < sVar5))));
          }
          iVar14 = iVar14 + 4;
          bVar9 = bVar9 + 2;
        }
        uVar13 = (ulong)((int)uVar13 + 1);
      }
      pvVar18 = (void *)((long)pvVar18 + 0x10);
    }
  }
  operator_delete__(pvVar11);
  return;
}

Assistant:

void FDDSTexture::DecompressDXT3 (FWadLump &lump, bool premultiplied, BYTE *tcbuf)
{
	const long blocklinelen = ((Width + 3) >> 2) << 4;
	BYTE *blockbuff = new BYTE[blocklinelen];
	BYTE *block;
	PalEntry color[4];
	BYTE palcol[4];
	int ox, oy, x, y, i;

	for (oy = 0; oy < Height; oy += 4)
	{
		lump.Read (blockbuff, blocklinelen);
		block = blockbuff;
		for (ox = 0; ox < Width; ox += 4)
		{
			WORD color16[2] = { LittleShort(((WORD *)block)[4]), LittleShort(((WORD *)block)[5]) };

			// Convert color from R5G6B5 to R8G8B8.
			for (i = 1; i >= 0; --i)
			{
				color[i].r = ((color16[i] & 0xF800) >> 8) | (color16[i] >> 13);
				color[i].g = ((color16[i] & 0x07E0) >> 3) | ((color16[i] & 0x0600) >> 9);
				color[i].b = ((color16[i] & 0x001F) << 3) | ((color16[i] & 0x001C) >> 2);
			}
			// Derive the other two colors.
			color[2].r = (color[0].r + color[0].r + color[1].r + 1) / 3;
			color[2].g = (color[0].g + color[0].g + color[1].g + 1) / 3;
			color[2].b = (color[0].b + color[0].b + color[1].b + 1) / 3;

			color[3].r = (color[0].r + color[1].r + color[1].r + 1) / 3;
			color[3].g = (color[0].g + color[1].g + color[1].g + 1) / 3;
			color[3].b = (color[0].b + color[1].b + color[1].b + 1) / 3;

			// Pick colors from the palette for each of the four colors.
			if (!tcbuf) for (i = 3; i >= 0; --i)
			{
				palcol[i] = RGB32k.RGB[color[i].r >> 3][color[i].g >> 3][color[i].b >> 3];
			}
			// Now decode this 4x4 block to the pixel buffer.
			for (y = 0; y < 4; ++y)
			{
				if (oy + y >= Height)
				{
					break;
				}
				BYTE yslice = block[12 + y];
				WORD yalphaslice = LittleShort(((WORD *)block)[y]);
				for (x = 0; x < 4; ++x)
				{
					if (ox + x >= Width)
					{
						break;
					}
					if (!tcbuf)
					{
						Pixels[oy + y + (ox + x) * Height] = ((yalphaslice >> (x*4)) & 15) < 8 ?
							(bMasked = true, 0) : palcol[(yslice >> (x + x)) & 3];
					}
					else
					{
						BYTE * tcp = &tcbuf[(ox + x)*4 + (oy + y) * Width*4];
						int c = (yslice >> (x + x)) & 3;
						tcp[0] = color[c].r;
						tcp[1] = color[c].g;
						tcp[2] = color[c].b;
						tcp[3] = color[c].a;
					}
				}
			}
			block += 16;
		}
	}
	delete[] blockbuff;
}